

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tcb::unicode::detail::unicode_view::operator_cast_to_string
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,unicode_view *this)

{
  code_point cVar1;
  code_point value;
  
  if (*(code_point **)this != *(code_point **)(this + 8)) {
    cVar1 = **(code_point **)this;
    value = L'\xffffffff';
    if ((cVar1 & 0x1ff800U) != 0xd800) {
      value = cVar1;
    }
    if (0x10ffff < (uint)cVar1) {
      value = L'\xffffffff';
    }
    utf_traits<char,_1>::encode(value);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,char32_t,char>::iterator>
            ((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

constexpr operator Container() const
    {
        return Container(begin(), end());
    }